

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

uint __thiscall o3dgc::Arithmetic_Codec::get_bit(Arithmetic_Codec *this)

{
  uint uVar1;
  uint bit;
  Arithmetic_Codec *this_local;
  
  this->length = this->length >> 1;
  uVar1 = (uint)(this->length <= this->value);
  if (uVar1 != 0) {
    this->value = this->value - this->length;
  }
  if (this->length < 0x1000000) {
    renorm_dec_interval(this);
  }
  return uVar1;
}

Assistant:

unsigned Arithmetic_Codec::get_bit(void)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      length >>= 1;                                              // halve interval
      unsigned bit = (value >= length);                              // decode bit
      if (bit) value -= length;                                       // move base

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      return bit;                                         // return data bit value
    }